

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O2

void __thiscall
RuntimeObjectSystem::OnFileChange(RuntimeObjectSystem *this,IAUDynArray<const_char_*> *filelist)

{
  ICompilerLogger *pIVar1;
  pointer ppcVar2;
  bool bVar3;
  __type _Var4;
  __normal_iterator<FileSystemUtils::Path_*,_std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>_>
  _Var5;
  pointer pPVar6;
  _Base_ptr p_Var7;
  _Rb_tree_iterator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_> _Var8;
  ulong uVar9;
  vector<BuildTool::FileToBuild,_std::allocator<BuildTool::FileToBuild>_> *pvVar10;
  ulong uVar11;
  TFileToFilesIterator it2;
  pair<std::_Rb_tree_iterator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>,_std::_Rb_tree_iterator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
  pVar12;
  FileToBuild fileToBuild2;
  FileToBuild fileToBuild;
  FileToBuild local_90;
  FileToBuild local_60;
  
  if (this->m_bAutoCompile == true) {
    uVar11 = 0;
    while( true ) {
      uVar11 = uVar11 & 0xffff;
      pPVar6 = (this->m_Projects).
               super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->m_Projects).
                         super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar6) / 0x1c8) <=
          uVar11) break;
      pvVar10 = &pPVar6->m_BuildFileList;
      if (this->m_bCompiling != false) {
        pvVar10 = &pPVar6->m_PendingBuildFileList;
      }
      pvVar10 = pvVar10 + uVar11 * 0x13;
      pIVar1 = this->m_pCompilerLogger;
      if (pIVar1 != (ICompilerLogger *)0x0) {
        (**(code **)(*(long *)pIVar1 + 0x10))
                  (pIVar1,"FileChangeNotifier triggered recompile with changes to:\n");
      }
      for (uVar9 = 0;
          ppcVar2 = (filelist->m_vec).
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
          uVar9 < (ulong)((long)(filelist->m_vec).
                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar2 >> 3);
          uVar9 = uVar9 + 1) {
        pPVar6 = (this->m_Projects).
                 super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        _Var5 = std::
                __find_if<__gnu_cxx::__normal_iterator<FileSystemUtils::Path*,std::vector<FileSystemUtils::Path,std::allocator<FileSystemUtils::Path>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                          (pPVar6[uVar11].m_RuntimeFileList.
                           super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           *(pointer *)
                            ((long)&pPVar6[uVar11].m_RuntimeFileList.
                                    super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                                    ._M_impl + 8),ppcVar2 + uVar9);
        if (_Var5._M_current !=
            *(pointer *)
             ((long)&(this->m_Projects).
                     super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar11].m_RuntimeFileList.
                     super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                     ._M_impl + 8)) {
          pIVar1 = this->m_pCompilerLogger;
          if (pIVar1 != (ICompilerLogger *)0x0) {
            (**(code **)(*(long *)pIVar1 + 0x10))
                      (pIVar1,"    File %s\n",
                       (filelist->m_vec).
                       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar9]);
          }
          FileSystemUtils::Path::Path
                    (&local_90.filePath,
                     (filelist->m_vec).
                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar9]);
          BuildTool::FileToBuild::FileToBuild(&local_60,&local_90.filePath);
          FileSystemUtils::Path::~Path(&local_90.filePath);
          FileSystemUtils::Path::Extension_abi_cxx11_((string *)&local_90,&local_60.filePath);
          bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_90,".h");
          std::__cxx11::string::~string((string *)&local_90);
          if (bVar3) {
            std::vector<BuildTool::FileToBuild,_std::allocator<BuildTool::FileToBuild>_>::push_back
                      (pvVar10,&local_60);
            pPVar6 = (this->m_Projects).
                     super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            p_Var7 = *(_Base_ptr *)
                      ((long)&pPVar6[uVar11].m_RuntimeSourceDependencyMap._M_t._M_impl + 0x18);
            while (p_Var7 != (_Rb_tree_node_base *)
                             ((long)&pPVar6[uVar11].m_RuntimeSourceDependencyMap._M_t._M_impl + 8U))
            {
              _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&p_Var7[2]._M_left,&local_60.filePath.m_string);
              if (_Var4) {
                BuildTool::FileToBuild::FileToBuild(&local_90,(Path *)(p_Var7 + 1));
                std::vector<BuildTool::FileToBuild,_std::allocator<BuildTool::FileToBuild>_>::
                push_back(pvVar10,&local_90);
                FileSystemUtils::Path::~Path(&local_90.filePath);
              }
              p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
              pPVar6 = (this->m_Projects).
                       super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            }
          }
          else {
            pVar12 = std::
                     _Rb_tree<FileSystemUtils::Path,_std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>,_std::_Select1st<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
                     ::equal_range(&(this->m_Projects).
                                    super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar11].
                                    m_RuntimeIncludeMap._M_t,&local_60.filePath);
            for (_Var8 = pVar12.first._M_node; _Var8._M_node != pVar12.second._M_node._M_node;
                _Var8._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var8._M_node)) {
              FileSystemUtils::Path::Path(&local_90.filePath,(Path *)&_Var8._M_node[2]._M_parent);
              local_90.forceCompile = true;
              std::vector<BuildTool::FileToBuild,_std::allocator<BuildTool::FileToBuild>_>::
              push_back(pvVar10,&local_90);
              FileSystemUtils::Path::~Path(&local_90.filePath);
            }
          }
          FileSystemUtils::Path::~Path(&local_60.filePath);
        }
      }
      uVar11 = (ulong)((int)uVar11 + 1);
    }
    if (this->m_bCompiling == false) {
      StartRecompile(this);
    }
  }
  return;
}

Assistant:

void RuntimeObjectSystem::OnFileChange(const IAUDynArray<const char*>& filelist)
{
	if( !m_bAutoCompile )
	{
		return;
	}

    for( unsigned short proj = 0; proj < m_Projects.size(); ++proj )
    {

        std::vector<BuildTool::FileToBuild>* pBuildFileList = &m_Projects[ proj ].m_BuildFileList;
        if( m_bCompiling )
        {
            pBuildFileList = &m_Projects[ proj ].m_PendingBuildFileList;
        }


        if (m_pCompilerLogger) { m_pCompilerLogger->LogInfo( "FileChangeNotifier triggered recompile with changes to:\n" ); }
        for( size_t i = 0; i < filelist.Size(); ++i )
        {
            // check this file is in our project list
            TFileList::iterator it = std::find( m_Projects[ proj ].m_RuntimeFileList.begin( ), m_Projects[ proj ].m_RuntimeFileList.end( ), filelist[i] );
            if( it == m_Projects[ proj ].m_RuntimeFileList.end() )
            {
                continue;
            }

            if (m_pCompilerLogger) { m_pCompilerLogger->LogInfo( "    File %s\n", filelist[ i ] ); }
            BuildTool::FileToBuild fileToBuild( filelist[ i ] );

            bool bFindIncludeDependencies = true;  // if this is a header or a source dependency need to find include dependencies
            bool bForceIncludeDependencies = true;
            if( fileToBuild.filePath.Extension() != ".h" ) //TODO: change to check for .cpp and .c as could have .inc files etc.?
            {
                bFindIncludeDependencies = false;
                pBuildFileList->push_back( fileToBuild );

                // file may be a source dependency, check
                TFileToFilesIterator itrCurr = m_Projects[ proj ].m_RuntimeSourceDependencyMap.begin( );
                while( itrCurr != m_Projects[ proj ].m_RuntimeSourceDependencyMap.end( ) )
                {
                    if( itrCurr->second == fileToBuild.filePath )
                    {
                        BuildTool::FileToBuild fileToBuild2( itrCurr->first );
                        pBuildFileList->push_back( fileToBuild2 );
                    }
                    ++itrCurr;
                }
           }

            if( bFindIncludeDependencies )
            {
                TFileToFilesEqualRange range = m_Projects[ proj ].m_RuntimeIncludeMap.equal_range( fileToBuild.filePath );
                for( TFileToFilesIterator it2 = range.first; it2 != range.second; ++it2 )
                {
                    BuildTool::FileToBuild fileToBuildFromIncludes( ( *it2 ).second, bForceIncludeDependencies );
                    pBuildFileList->push_back( fileToBuildFromIncludes );
                }
            }
        }
    }

	if( !m_bCompiling )
	{
		StartRecompile();
	}
}